

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::json::null_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool local_49;
  void *local_48;
  bool local_39;
  void *local_38;
  char local_29;
  maybe<char,_void> *pmStack_28;
  char c;
  maybe<char,_void> *ch_local;
  parser<pstore::json::null_output> *parser_local;
  whitespace_matcher<pstore::json::null_output> *this_local;
  
  pmStack_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  this_local = (whitespace_matcher<pstore::json::null_output> *)__return_storage_ptr__;
  bVar1 = maybe::operator_cast_to_bool((maybe *)ch);
  if (bVar1) {
    pcVar3 = maybe<char,_void>::operator*(ch);
    local_29 = *pcVar3;
    iVar2 = matcher<pstore::json::null_output>::get_state
                      (&this->super_matcher<pstore::json::null_output>);
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x5b6);
    case 3:
      matcher<pstore::json::null_output>::set_state
                (&this->super_matcher<pstore::json::null_output>,2);
      bVar1 = crlf(this,(parser<pstore::json::null_output> *)ch_local,local_29);
      if (bVar1) break;
    case 2:
      consume_body(__return_storage_ptr__,this,(parser<pstore::json::null_output> *)ch_local,
                   local_29);
      return __return_storage_ptr__;
    case 4:
      bVar1 = parser<pstore::json::null_output>::extension_enabled
                        ((parser<pstore::json::null_output> *)ch_local,bash_comments);
      if (((!bVar1) &&
          (bVar1 = parser<pstore::json::null_output>::extension_enabled
                             ((parser<pstore::json::null_output> *)ch_local,single_line_comments),
          !bVar1)) &&
         (bVar1 = parser<pstore::json::null_output>::extension_enabled
                            ((parser<pstore::json::null_output> *)ch_local,multi_line_comments),
         !bVar1)) {
        assert_failed("parser.extension_enabled (extensions::bash_comments) || parser.extension_enabled (extensions::single_line_comments) || parser.extension_enabled (extensions::multi_line_comments)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x5ac);
      }
      if ((local_29 == '\r') || (local_29 == '\n')) {
        matcher<pstore::json::null_output>::set_state
                  (&this->super_matcher<pstore::json::null_output>,2);
        local_38 = (void *)0x0;
        local_39 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
        ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_38,&local_39);
        return __return_storage_ptr__;
      }
      break;
    case 5:
      consume_comment_start
                (__return_storage_ptr__,this,(parser<pstore::json::null_output> *)ch_local,local_29)
      ;
      return __return_storage_ptr__;
    case 6:
switchD_001f90ac_caseD_6:
      multi_line_comment_body
                (__return_storage_ptr__,this,(parser<pstore::json::null_output> *)ch_local,local_29)
      ;
      return __return_storage_ptr__;
    case 7:
      bVar1 = parser<pstore::json::null_output>::extension_enabled
                        ((parser<pstore::json::null_output> *)ch_local,multi_line_comments);
      if (!bVar1) {
        assert_failed("parser.extension_enabled (extensions::multi_line_comments)",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x59a);
      }
      iVar2 = 6;
      if (local_29 == '/') {
        iVar2 = 2;
      }
      matcher<pstore::json::null_output>::set_state
                (&this->super_matcher<pstore::json::null_output>,iVar2);
      break;
    case 8:
      matcher<pstore::json::null_output>::set_state
                (&this->super_matcher<pstore::json::null_output>,6);
      bVar1 = crlf(this,(parser<pstore::json::null_output> *)ch_local,local_29);
      if (!bVar1) goto switchD_001f90ac_caseD_6;
    }
  }
  else {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,1)
    ;
  }
  local_48 = (void *)0x0;
  local_49 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_48,&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_state (done_state);
                } else {
                    char const c = *ch;
                    switch (this->get_state ()) {
                    // Handles the LF part of a Windows-style CR/LF pair.
                    case crlf_state:
                        this->set_state (body_state);
                        if (crlf (parser, c)) {
                            break;
                        }
                        PSTORE_FALLTHROUGH;
                    case body_state: return this->consume_body (parser, c);
                    case comment_start_state: return this->consume_comment_start (parser, c);

                    case multi_line_comment_ending_state:
                        PSTORE_ASSERT (parser.extension_enabled (extensions::multi_line_comments));
                        this->set_state (c == details::char_set::slash
                                             ? body_state
                                             : multi_line_comment_body_state);
                        break;

                    case multi_line_comment_crlf_state:
                        this->set_state (multi_line_comment_body_state);
                        if (crlf (parser, c)) {
                            break;
                        }
                        PSTORE_FALLTHROUGH;
                    case multi_line_comment_body_state:
                        return this->multi_line_comment_body (parser, c);
                    case single_line_comment_state:
                        PSTORE_ASSERT (
                            parser.extension_enabled (extensions::bash_comments) ||
                            parser.extension_enabled (extensions::single_line_comments) ||
                            parser.extension_enabled (extensions::multi_line_comments));
                        if (c == details::char_set::cr || c == details::char_set::lf) {
                            // This character marks a bash/single-line comment end. Go back to
                            // normal whitespace handling. Retry with the same character.
                            this->set_state (body_state);
                            return {nullptr, false};
                        }
                        // Just consume the character.
                        break;

                    case done_state: PSTORE_ASSERT (false); break;
                    }
                }
                return {nullptr, true};
            }